

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildBrLocalProperty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  uint uVar4;
  RegSlot reg;
  undefined4 *puVar5;
  OpLayoutBrLocalProperty *pOVar6;
  ByteCodeUsesInstr *this_00;
  JITTimeFunctionBody *pJVar7;
  SymOpnd *srcOpnd;
  BranchInstr *branchInstr;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d0c,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004cd3fc;
    *puVar5 = 0;
  }
  if (newOpcode != BrOnHasLocalProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d0d,"(newOpcode == Js::OpCode::BrOnHasLocalProperty)",
                       "newOpcode == Js::OpCode::BrOnHasLocalProperty");
    if (!bVar3) {
LAB_004cd3fc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::BrLocalProperty(&this->m_jnReader);
  if ((this->m_func->m_localClosureSym->field_0x19 & 0x20) != 0) {
    this_00 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
    IR::ByteCodeUsesInstr::SetNonOpndSymbol
              (this_00,(this->m_func->m_localClosureSym->super_Sym).m_id);
    AddInstr(this,&this_00->super_Instr,offset);
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(pJVar7,pOVar6->PropertyIdIndex);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar6->RelativeJumpOffset;
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  reg = JITTimeFunctionBody::GetLocalClosureReg(pJVar7);
  srcOpnd = BuildFieldOpnd(this,newOpcode,reg,propertyId,pOVar6->PropertyIdIndex,PropertyKindData,
                           0xffffffff);
  branchInstr = IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,&srcOpnd->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,(int)sVar1 + uVar4);
  return;
}

Assistant:

void
IRBuilder::BuildBrLocalProperty(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));
    Assert(newOpcode == Js::OpCode::BrOnHasLocalProperty);

    const unaligned   Js::OpLayoutBrLocalProperty *branchInsn = m_jnReader.BrLocalProperty();

    if (m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
    {
        IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
        byteCodeUse->SetNonOpndSymbol(m_func->GetLocalClosureSym()->m_id);
        this->AddInstr(byteCodeUse, offset);
    }

    IR::BranchInstr * branchInstr;
    Js::PropertyId    propertyId =
        m_func->GetJITFunctionBody()->GetReferencedPropertyId(branchInsn->PropertyIdIndex);
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
    IR::SymOpnd *     fieldSymOpnd = this->BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, branchInsn->PropertyIdIndex, PropertyKindData);

    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, fieldSymOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}